

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *value)

{
  size_t sVar1;
  char *pcVar2;
  String local_1c0;
  undefined1 local_1a0 [8];
  OStringStream oss;
  char *value_local;
  Value *this_local;
  
  Comments::Comments(&this->comments_);
  initBasic(this,stringValue,true);
  if (value == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,"Null Value Passed to Value Constructor");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  }
  sVar1 = strlen(value);
  pcVar2 = duplicateAndPrefixStringValue(value,(uint)sVar1);
  (this->value_).string_ = pcVar2;
  return;
}

Assistant:

Value::Value(const char* value) {
  initBasic(stringValue, true);
  JSON_ASSERT_MESSAGE(value != nullptr,
                      "Null Value Passed to Value Constructor");
  value_.string_ = duplicateAndPrefixStringValue(
      value, static_cast<unsigned>(strlen(value)));
}